

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

int write_to_file(WFile *f,void *buffer,int length)

{
  int iVar1;
  ssize_t sVar2;
  int local_34;
  int ret;
  int so_far;
  char *p;
  int length_local;
  void *buffer_local;
  WFile *f_local;
  
  local_34 = 0;
  _ret = buffer;
  p._4_4_ = length;
  while( true ) {
    if (p._4_4_ < 1) {
      return local_34;
    }
    sVar2 = write(f->fd,_ret,(long)p._4_4_);
    iVar1 = (int)sVar2;
    if (iVar1 < 0) break;
    if (iVar1 == 0) {
      return local_34;
    }
    _ret = (void *)((long)_ret + (long)iVar1);
    p._4_4_ = p._4_4_ - iVar1;
    local_34 = iVar1 + local_34;
  }
  return iVar1;
}

Assistant:

int write_to_file(WFile *f, void *buffer, int length)
{
    char *p = (char *)buffer;
    int so_far = 0;

    /* Keep trying until we've really written as much as we can. */
    while (length > 0) {
        int ret = write(f->fd, p, length);

        if (ret < 0)
            return ret;

        if (ret == 0)
            break;

        p += ret;
        length -= ret;
        so_far += ret;
    }

    return so_far;
}